

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O2

mg_relationship *
mg_relationship_make(int64_t id,int64_t start_id,int64_t end_id,mg_string *type,mg_map *properties)

{
  mg_relationship *pmVar1;
  
  pmVar1 = (mg_relationship *)mg_allocator_malloc(&mg_system_allocator,0x28);
  if (pmVar1 != (mg_relationship *)0x0) {
    pmVar1->id = id;
    pmVar1->start_id = start_id;
    pmVar1->end_id = end_id;
    pmVar1->type = type;
    pmVar1->properties = properties;
  }
  return pmVar1;
}

Assistant:

mg_relationship *mg_relationship_make(int64_t id, int64_t start_id,
                                      int64_t end_id, mg_string *type,
                                      mg_map *properties) {
  mg_relationship *rel =
      mg_allocator_malloc(&mg_system_allocator, sizeof(mg_relationship));
  if (!rel) {
    return NULL;
  }
  rel->id = id;
  rel->start_id = start_id;
  rel->end_id = end_id;
  rel->type = type;
  rel->properties = properties;
  return rel;
}